

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O0

bool __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
::operator==(cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
             *this,cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
                   *it)

{
  bool bVar1;
  bool local_19;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  *it_local;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  *this_local;
  
  local_19 = false;
  if (this->_nranges == it->_nranges) {
    bVar1 = std::operator==(&this->_begins,&it->_begins);
    local_19 = false;
    if (bVar1) {
      bVar1 = std::operator==(&this->_ends,&it->_ends);
      local_19 = false;
      if (bVar1) {
        local_19 = std::operator==(&this->_its,&it->_its);
      }
    }
  }
  return local_19;
}

Assistant:

bool operator==(tchecker::cartesian_iterator_t<R> const & it) const
  {
    return ((_nranges == it._nranges) && (_begins == it._begins) && (_ends == it._ends) && (_its == it._its));
  }